

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

string * __thiscall
t_rs_generator::rust_snake_case(string *__return_storage_ptr__,t_rs_generator *this,string *name)

{
  t_rs_generator *this_00;
  allocator local_9a;
  allocator local_99;
  undefined1 local_98 [32];
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_58,(string *)name);
  t_generator::underscore(&local_38,&this->super_t_generator,&local_58);
  t_generator::decapitalize(__return_storage_ptr__,&this->super_t_generator,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_78,"__",&local_99);
  this_00 = (t_rs_generator *)local_98;
  std::__cxx11::string::string((string *)this_00,"_",&local_9a);
  string_replace(this_00,__return_storage_ptr__,&local_78,(string *)local_98);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::rust_snake_case(const string& name) {
  string str(decapitalize(underscore(name)));
  string_replace(str, "__", "_");
  return str;
}